

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

Var * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Var>(Allocator *this,Var *ast)

{
  size_t *psVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  Var *pVVar6;
  _List_node_base *p_Var7;
  
  pVVar6 = (Var *)operator_new(0x88);
  (pVVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_00248918;
  (pVVar6->super_AST).location.file._M_dataplus._M_p =
       (pointer)&(pVVar6->super_AST).location.file.field_2;
  pcVar2 = (ast->super_AST).location.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pVVar6->super_AST).location,pcVar2,
             pcVar2 + (ast->super_AST).location.file._M_string_length);
  uVar3 = (ast->super_AST).location.begin.line;
  uVar4 = (ast->super_AST).location.begin.column;
  uVar5 = (ast->super_AST).location.end.column;
  (pVVar6->super_AST).location.end.line = (ast->super_AST).location.end.line;
  (pVVar6->super_AST).location.end.column = uVar5;
  (pVVar6->super_AST).location.begin.line = uVar3;
  (pVVar6->super_AST).location.begin.column = uVar4;
  (pVVar6->super_AST).type = (ast->super_AST).type;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&(pVVar6->super_AST).openFodder,&(ast->super_AST).openFodder);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&(pVVar6->super_AST).freeVariables,&(ast->super_AST).freeVariables);
  (pVVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_00248a98;
  pVVar6->id = ast->id;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)pVVar6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return pVVar6;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }